

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.h
# Opt level: O3

void __thiscall cfd::core::Address::~Address(Address *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&this->format_data_);
  Script::~Script(&this->redeem_script_);
  (this->script_tree_).super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&(this->script_tree_).nodes_);
  TapBranch::~TapBranch(&(this->script_tree_).super_TapBranch);
  puVar1 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->hash_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pcVar2 = (this->address_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->address_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT Address {
 public:
  /**
   * @brief default constructor.
   */
  Address();
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  Address(const Address& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  Address& operator=(const Address& object);

  /**
   * @brief Constructor. (for string)
   * @param[in] address_string      address string
   */
  explicit Address(const std::string& address_string);
  /**
   * @brief Constructor. (for string)
   * @param[in] address_string      address string
   * @param[in] network_parameters  network parameter list
   */
  explicit Address(
      const std::string& address_string,
      const std::vector<AddressFormatData>& network_parameters);
  /**
   * @brief Constructor. (for string)
   * @param[in] address_string      address string
   * @param[in] network_parameter   network parameter
   */
  explicit Address(
      const std::string& address_string,
      const AddressFormatData& network_parameter);

  /**
   * @brief Constructor. (for P2PKH)
   * @param[in] type      NetType
   * @param[in] pubkey    PublicKey
   */
  Address(NetType type, const Pubkey& pubkey);
  /**
   * @brief Constructor. (for P2PKH)
   * @param[in] type      NetType
   * @param[in] pubkey    PublicKey
   * @param[in] prefix    p2pkh prefix
   */
  Address(NetType type, const Pubkey& pubkey, uint8_t prefix);
  /**
   * @brief Constructor. (for P2PKH)
   * @param[in] type      NetType
   * @param[in] pubkey    PublicKey
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, const Pubkey& pubkey,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for P2PKH)
   * @param[in] type      NetType
   * @param[in] pubkey    PublicKey
   * @param[in] network_parameters   network parameter list
   */
  Address(
      NetType type, const Pubkey& pubkey,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for P2WPKH)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   */
  Address(NetType type, WitnessVersion witness_ver, const Pubkey& pubkey);
  /**
   * @brief Constructor. (for P2WPKH)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] bech32_hrp  bech32 hrp
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Pubkey& pubkey,
      const std::string& bech32_hrp);
  /**
   * @brief Constructor. (for P2WPKH)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Pubkey& pubkey,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for P2WPKH)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] network_parameters   network parameter list
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Pubkey& pubkey,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for P2SH)
   * @param[in] type          NetType
   * @param[in] redeem_script Redeem Script
   */
  Address(NetType type, const Script& redeem_script);
  /**
   * @brief Constructor. (for P2SH)
   * @param[in] type          NetType
   * @param[in] redeem_script Redeem Script
   * @param[in] prefix        p2sh prefix
   */
  Address(NetType type, const Script& redeem_script, uint8_t prefix);
  /**
   * @brief Constructor. (for P2SH)
   * @param[in] type          NetType
   * @param[in] redeem_script Redeem Script
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, const Script& redeem_script,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for P2SH)
   * @param[in] type          NetType
   * @param[in] redeem_script Redeem Script
   * @param[in] network_parameters   network parameter list
   */
  Address(
      NetType type, const Script& redeem_script,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for P2WSH)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] redeem_script Redeem Script
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Script& redeem_script);
  /**
   * @brief Constructor. (for P2WSH)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] redeem_script Redeem Script
   * @param[in] bech32_hrp    bech32 hrp
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Script& redeem_script,
      const std::string& bech32_hrp);
  /**
   * @brief Constructor. (for P2WSH)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] redeem_script Redeem Script
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Script& redeem_script,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for P2WSH)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] redeem_script Redeem Script
   * @param[in] network_parameters   network parameter list
   */
  Address(
      NetType type, WitnessVersion witness_ver, const Script& redeem_script,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   */
  Address(
      NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] bech32_hrp  bech32 hrp
   */
  Address(
      NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
      const std::string& bech32_hrp);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] pubkey      PublicKey
   * @param[in] network_parameters   network parameter list
   */
  Address(
      NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] tree                tapscript tree
   * @param[in] internal_pubkey     internal PublicKey
   */
  Address(
      NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
      const SchnorrPubkey& internal_pubkey);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] tree                tapscript tree
   * @param[in] internal_pubkey     internal PublicKey
   * @param[in] bech32_hrp  bech32 hrp
   */
  Address(
      NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
      const SchnorrPubkey& internal_pubkey, const std::string& bech32_hrp);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] tree                tapscript tree
   * @param[in] internal_pubkey     internal PublicKey
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
      const SchnorrPubkey& internal_pubkey,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for Taproot)
   * @param[in] type        NetType
   * @param[in] witness_ver Witness version
   * @param[in] tree                tapscript tree
   * @param[in] internal_pubkey     internal PublicKey
   * @param[in] network_parameters  network parameter list
   */
  Address(
      NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
      const SchnorrPubkey& internal_pubkey,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for P2PKH/P2SH)
   * @param[in] type          NetType
   * @param[in] addr_type     Address type
   * @param[in] hash          hashed data
   */
  Address(NetType type, AddressType addr_type, const ByteData160& hash);
  /**
   * @brief Constructor. (for P2PKH/P2SH)
   * @param[in] type          NetType
   * @param[in] addr_type     Address type
   * @param[in] hash          hashed data
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, AddressType addr_type, const ByteData160& hash,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for P2PKH/P2SH)
   * @param[in] type          NetType
   * @param[in] addr_type     Address type
   * @param[in] hash          hashed data
   * @param[in] network_parameters  network parameter list
   */
  Address(
      NetType type, AddressType addr_type, const ByteData160& hash,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Constructor. (for hashed data)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] hash          hashed data
   */
  Address(NetType type, WitnessVersion witness_ver, const ByteData& hash);
  /**
   * @brief Constructor. (for hashed data)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] hash          hashed data
   * @param[in] network_parameter   network parameter
   */
  Address(
      NetType type, WitnessVersion witness_ver, const ByteData& hash,
      const AddressFormatData& network_parameter);
  /**
   * @brief Constructor. (for hashed data)
   * @param[in] type          NetType
   * @param[in] witness_ver   Witness version
   * @param[in] hash          hashed data
   * @param[in] network_parameters  network parameter list
   */
  Address(
      NetType type, WitnessVersion witness_ver, const ByteData& hash,
      const std::vector<AddressFormatData>& network_parameters);

  /**
   * @brief Get address string.
   * @return address string
   */
  std::string GetAddress() const;

  /**
   * @brief Get network type.
   * @return NetType
   */
  NetType GetNetType() const { return type_; }

  /**
   * @brief Get address type.
   * @return Address type
   */
  AddressType GetAddressType() const { return addr_type_; }

  /**
   * @brief Get witness version.
   * @return Witness version
   */
  WitnessVersion GetWitnessVersion() const { return witness_ver_; }

  /**
   * @brief Get address Hash.
   * @return address hash
   */
  ByteData GetHash() const { return hash_; }

  /**
   * @brief Get PublicKey.
   * @return Pubkey
   */
  Pubkey GetPubkey() const { return pubkey_; }

  /**
   * @brief Get Schnorr PublicKey.
   * @return Schnorr Pubkey
   */
  SchnorrPubkey GetSchnorrPubkey() const { return schnorr_pubkey_; }
  /**
   * @brief Get taproot script tree.
   * @return taproot script tree
   */
  TaprootScriptTree GetScriptTree() const { return script_tree_; }

  /**
   * @brief Get Redeem Script.
   * @return Script
   */
  Script GetScript() const { return redeem_script_; }

  /**
   * @brief Get AddressFormatData.
   * @return AddressFormatData
   */
  AddressFormatData GetAddressFormatData() const { return format_data_; }

  /**
   * @brief Get LockingScript
   * @return locking script
   */
  Script GetLockingScript() const;

  /**
   * @brief Get the pegout address.
   * @param[in] type            network type
   * @param[in] locking_script  pegout locking script
   * @return address
   */
  static Address GetPegoutAddress(NetType type, const Script& locking_script);
  /**
   * @brief Get the pegout address.
   * @param[in] type            network type
   * @param[in] locking_script  pegout locking script
   * @param[in] network_parameter   network prefix parameter
   * @return address
   */
  static Address GetPegoutAddress(
      NetType type, const Script& locking_script,
      const AddressFormatData& network_parameter);
  /**
   * @brief Get the pegout address.
   * @param[in] type            network type
   * @param[in] locking_script  pegout locking script
   * @param[in] network_parameters  network prefix list
   * @return address
   */
  static Address GetPegoutAddress(
      NetType type, const Script& locking_script,
      const std::vector<AddressFormatData>& network_parameters);

 private:
  /**
   * @brief calculate P2SH Address
   * @param[in] prefix      p2sh prefix
   */
  void CalculateP2SH(uint8_t prefix = 0);
  /**
   * @brief calculate P2SH Address.
   * @param[in] hash_data   RedeemScript hash
   * @param[in] prefix      p2sh prefix
   */
  void CalculateP2SH(const ByteData160& hash_data, uint8_t prefix = 0);

  /**
   * @brief calculate P2PKH Address
   * @param[in] prefix      p2pkh prefix
   */
  void CalculateP2PKH(uint8_t prefix = 0);
  /**
   * @brief calculate P2PKH Address
   * @param[in] hash_data   Pubkey hash
   * @param[in] prefix      p2pkh prefix
   */
  void CalculateP2PKH(const ByteData160& hash_data, uint8_t prefix = 0);

  /**
   * @brief calculate P2WSH Address
   * @param[in] bech32_hrp    bech32 hrp
   */
  void CalculateP2WSH(const std::string& bech32_hrp = "");
  /**
   * @brief calculate P2WSH Address
   * @param[in] hash_data   RedeemScript hash
   * @param[in] bech32_hrp  bech32 hrp
   */
  void CalculateP2WSH(
      const ByteData256& hash_data,  // script hash
      const std::string& bech32_hrp = "");

  /**
   * @brief calculate P2WPKH Address
   * @param[in] bech32_hrp    bech32 hrp
   */
  void CalculateP2WPKH(const std::string& bech32_hrp = "");
  /**
   * @brief calculate P2WPKH Address
   * @param[in] hash_data   pubkey hash
   * @param[in] bech32_hrp  bech32 hrp
   */
  void CalculateP2WPKH(
      const ByteData160& hash_data,  // pubkey hash
      const std::string& bech32_hrp = "");

  /**
   * @brief calculate Taproot Address
   * @param[in] bech32_hrp    bech32 hrp
   */
  void CalculateTaproot(const std::string& bech32_hrp = "");
  /**
   * @brief calculate Bech32m Address
   * @param[in] hash_data   hash data
   * @param[in] bech32_hrp  bech32 hrp
   */
  void CalculateBech32m(
      const ByteData& hash_data,  // hash data
      const std::string& bech32_hrp = "");

  /**
   * @brief decode address from address string.
   * @param[in] address_string      address string
   * @param[in] network_parameters  network parameter list
   */
  void DecodeAddress(
      std::string address_string,  // LF
      const std::vector<AddressFormatData>* network_parameters);

  /**
   * @brief set network type.
   * @param[in] format_data   Address format data
   */
  void SetNetType(const AddressFormatData& format_data);

  /**
   * @brief set address type.
   * @param[in] addr_type   Address type
   */
  void SetAddressType(AddressType addr_type);

  /**
   * @brief Get AddressFormatData with NetType from format list.
   * @param[in] network_parameters  Address format data list
   * @param[in] type                NetType
   * @return Address format data
   */
  static AddressFormatData GetTargetFormatData(
      const std::vector<AddressFormatData>& network_parameters, NetType type);

  //! address's NetType
  NetType type_;

  //! address type
  AddressType addr_type_;

  //! Witness version
  WitnessVersion witness_ver_;

  //! address string
  std::string address_;

  //! address Hash
  ByteData hash_;

  //! PublicKey
  Pubkey pubkey_;

  SchnorrPubkey schnorr_pubkey_;   //!< Schnorr PublicKey
  TaprootScriptTree script_tree_;  //!< Taproot ScriptTree

  //! Redeem Script
  Script redeem_script_;

  //! checksum
  uint8_t checksum_[4];

  //! address prefix format data
  AddressFormatData format_data_;
}